

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

bool __thiscall Js::DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(DynamicTypeHandler *this)

{
  bool bVar1;
  bool isObjectHeaderInlined;
  DynamicTypeHandler *this_local;
  
  bVar1 = IsObjectHeaderInlinedTypeHandlerUnchecked(this);
  if (bVar1) {
    VerifyObjectHeaderInlinedTypeHandler(this);
  }
  return bVar1;
}

Assistant:

bool DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler() const
    {
        const bool isObjectHeaderInlined = IsObjectHeaderInlinedTypeHandlerUnchecked();
        if(isObjectHeaderInlined)
        {
            VerifyObjectHeaderInlinedTypeHandler();
        }
        return isObjectHeaderInlined;
    }